

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void y_array_suite::y_array_with_leading_space(void)

{
  char input [5];
  reader reader;
  undefined4 local_174;
  view_type local_170;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160," [1]",5);
  local_170._M_len = strlen(local_160);
  local_170._M_str = local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xb04,"void y_array_suite::y_array_with_leading_space()",&local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_174 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xb06,"void y_array_suite::y_array_with_leading_space()",&local_170,&local_174);
  local_170._M_len._0_4_ = trial::protocol::json::basic_reader<char>::value<int>(&local_158);
  local_174 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xb07,"void y_array_suite::y_array_with_leading_space()",&local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_174 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xb09,"void y_array_suite::y_array_with_leading_space()",&local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xb0b,"void y_array_suite::y_array_with_leading_space()",&local_170,&local_174);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void y_array_with_leading_space()
{
    const char input[] = " [1]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}